

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::objectivec::FilePath_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,FileDescriptor *file)

{
  string *psVar1;
  undefined1 in_R8B;
  undefined7 in_register_00000081;
  string_view path;
  string_view filename;
  string_view input;
  string basename;
  string directory;
  string output;
  AlphaNum local_98;
  undefined1 local_68 [40];
  _Alloc_hider local_40;
  
  psVar1 = &basename;
  output._M_dataplus._M_p = (pointer)&output.field_2;
  output._M_string_length = 0;
  basename._M_dataplus._M_p = (pointer)&basename.field_2;
  basename._M_string_length = 0;
  output.field_2._M_local_buf[0] = '\0';
  basename.field_2._M_local_buf[0] = '\0';
  directory._M_dataplus._M_p = (pointer)&directory.field_2;
  directory._M_string_length = 0;
  directory.field_2._M_local_buf[0] = '\0';
  path._M_str = (char *)&directory;
  path._M_len = **(size_t **)(this + 8);
  anon_unknown_0::PathSplit
            ((anon_unknown_0 *)(*(size_t **)(this + 8))[1],path,&basename,
             (string *)CONCAT71(in_register_00000081,in_R8B));
  if (directory._M_string_length != 0) {
    local_98.piece_._M_len = directory._M_string_length;
    local_98.piece_._M_str = directory._M_dataplus._M_p;
    join_0x00000010_0x00000000_ = absl::lts_20240722::NullSafeStringView("/");
    psVar1 = (string *)(local_68 + 0x20);
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_68,&local_98);
    std::__cxx11::string::operator=((string *)&output,(string *)local_68);
    std::__cxx11::string::~string((string *)local_68);
  }
  filename._M_str = (char *)psVar1;
  filename._M_len = (size_t)basename._M_dataplus._M_p;
  StripProto_abi_cxx11_((string *)&local_98,(compiler *)basename._M_string_length,filename);
  std::__cxx11::string::operator=((string *)&basename,(string *)&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  input._M_str = (char *)0x1;
  input._M_len = (size_t)basename._M_dataplus._M_p;
  (anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
            ((string *)&local_98,(_anonymous_namespace_ *)basename._M_string_length,input,
             (bool)in_R8B);
  std::__cxx11::string::operator=((string *)&basename,(string *)&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  local_98.piece_._M_len = output._M_string_length;
  local_98.piece_._M_str = output._M_dataplus._M_p;
  local_40 = (_Alloc_hider)basename._M_dataplus._M_p;
  local_68._32_8_ = basename._M_string_length;
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_98);
  std::__cxx11::string::~string((string *)&directory);
  std::__cxx11::string::~string((string *)&basename);
  std::__cxx11::string::~string((string *)&output);
  return __return_storage_ptr__;
}

Assistant:

std::string FilePath(const FileDescriptor* file) {
  std::string output;
  std::string basename;
  std::string directory;
  PathSplit(file->name(), &directory, &basename);
  if (!directory.empty()) {
    output = absl::StrCat(directory, "/");
  }
  basename = StripProto(basename);

  // CamelCase to be more ObjC friendly.
  basename = UnderscoresToCamelCase(basename, true);

  return absl::StrCat(output, basename);
}